

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compute_variance.cpp
# Opt level: O1

void brent_kung_prefix_sum(vfloat4 *d,size_t items,int stride)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  vfloat4 *pvVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (1 < items) {
    lVar4 = (long)stride;
    uVar7 = 2;
    bVar5 = 1;
    do {
      uVar8 = items >> (bVar5 & 0x3f);
      if (uVar8 != 0) {
        lVar6 = (uVar7 - 1) * lVar4 * 0x10;
        pvVar10 = d;
        do {
          pfVar1 = (float *)((long)pvVar10->m + lVar6);
          pfVar2 = (float *)((long)pvVar10->m +
                            (uVar7 * 0x10 + (uVar7 >> 1) * -0x10 + -0x10) * lVar4);
          auVar11._0_4_ = *pfVar1 + *pfVar2;
          auVar11._4_4_ = pfVar1[1] + pfVar2[1];
          auVar11._8_4_ = pfVar1[2] + pfVar2[2];
          auVar11._12_4_ = pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])((long)pvVar10->m + lVar6) = auVar11;
          pvVar10 = pvVar10 + (stride << (bVar5 & 0x1f));
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      bVar5 = bVar5 + 1;
      uVar7 = uVar7 * 2;
    } while (uVar7 <= items);
    do {
      bVar5 = bVar5 - 1;
      uVar9 = items - (uVar7 >> 2) >> (bVar5 & 0x3f);
      uVar8 = uVar7 >> 1;
      if (uVar9 != 0) {
        lVar6 = ((uVar7 >> 2) + uVar8 + -1) * lVar4 * 0x10;
        pvVar10 = d;
        do {
          pfVar1 = (float *)((long)pvVar10->m + lVar6);
          pfVar2 = (float *)((long)pvVar10->m + (uVar8 * 0x10 + -0x10) * lVar4);
          auVar12._0_4_ = *pfVar1 + *pfVar2;
          auVar12._4_4_ = pfVar1[1] + pfVar2[1];
          auVar12._8_4_ = pfVar1[2] + pfVar2[2];
          auVar12._12_4_ = pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])((long)pvVar10->m + lVar6) = auVar12;
          pvVar10 = pvVar10 + (stride << (bVar5 & 0x1f));
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      bVar3 = 5 < uVar7;
      uVar7 = uVar8;
    } while (bVar3);
  }
  return;
}

Assistant:

static void brent_kung_prefix_sum(
	vfloat4* d,
	size_t items,
	int stride
) {
	if (items < 2)
		return;

	size_t lc_stride = 2;
	size_t log2_stride = 1;

	// The reduction-tree loop
	do {
		size_t step = lc_stride >> 1;
		size_t start = lc_stride - 1;
		size_t iters = items >> log2_stride;

		vfloat4 *da = d + (start * stride);
		ptrdiff_t ofs = -static_cast<ptrdiff_t>(step * stride);
		size_t ofs_stride = stride << log2_stride;

		while (iters)
		{
			*da = *da + da[ofs];
			da += ofs_stride;
			iters--;
		}

		log2_stride += 1;
		lc_stride <<= 1;
	} while (lc_stride <= items);

	// The expansion-tree loop
	do {
		log2_stride -= 1;
		lc_stride >>= 1;

		size_t step = lc_stride >> 1;
		size_t start = step + lc_stride - 1;
		size_t iters = (items - step) >> log2_stride;

		vfloat4 *da = d + (start * stride);
		ptrdiff_t ofs = -static_cast<ptrdiff_t>(step * stride);
		size_t ofs_stride = stride << log2_stride;

		while (iters)
		{
			*da = *da + da[ofs];
			da += ofs_stride;
			iters--;
		}
	} while (lc_stride > 2);
}